

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::WordBoundaryTestInst<true>::Exec
          (WordBoundaryTestInst<true> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  StandardChars<char16_t> *pSVar1;
  bool local_45;
  bool local_44;
  bool curr;
  bool prev;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  WordBoundaryTestInst<true> *this_local;
  
  Matcher::CompStats(matcher);
  local_44 = false;
  if (*inputOffset != 0) {
    pSVar1 = Memory::WriteBarrierPtr<UnifiedRegex::StandardChars<char16_t>_>::operator->
                       (&matcher->standardChars);
    local_44 = StandardChars<char16_t>::IsWord(pSVar1,input[*inputOffset - 1]);
  }
  local_45 = false;
  if (*inputOffset < inputLength) {
    pSVar1 = Memory::WriteBarrierPtr<UnifiedRegex::StandardChars<char16_t>_>::operator->
                       (&matcher->standardChars);
    local_45 = StandardChars<char16_t>::IsWord(pSVar1,input[*inputOffset]);
  }
  if (local_44 == local_45) {
    *instPointer = *instPointer + 1;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  return this_local._7_1_;
}

Assistant:

inline bool WordBoundaryTestInst<isNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        const bool prev = inputOffset > 0 && matcher.standardChars->IsWord(input[inputOffset - 1]);
        const bool curr = inputOffset < inputLength && matcher.standardChars->IsWord(input[inputOffset]);
        if (isNegation == (prev != curr))
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        instPointer += sizeof(*this);
        return false;
    }